

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BGIP_SolverBranchAndBound.h
# Opt level: O1

void __thiscall
BGIP_SolverBranchAndBound<JointPolicyPureVector>::ExpandAllExtensions
          (BGIP_SolverBranchAndBound<JointPolicyPureVector> *this,BGIP_BnB_NodePtr *node)

{
  int *piVar1;
  sp_counted_base *psVar2;
  ostream *poVar3;
  ulong uVar4;
  ulong uVar5;
  bool bVar6;
  vector<unsigned_int,_std::allocator<unsigned_int>_> JAs;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_78;
  BGIP_BnB_NodePtr local_58;
  BGIP_BnB_NodePtr local_48;
  BGIP_BnB_NodePtr local_38;
  
  if (3 < this->_m_verbosity) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"BGIP_SolverBranchAndBound Expanding the following node: ",0x38
              );
    BGIP_BnB_Node::SoftPrint_abi_cxx11_((vector *)&local_78);
    poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cout,
                        (char *)local_78.
                                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                _M_impl.super__Vector_impl_data._M_start,
                        (long)local_78.
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_finish);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
    std::ostream::put((char)poVar3);
    std::ostream::flush();
    if ((pointer *)
        local_78.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_start !=
        &local_78.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
         super__Vector_impl_data._M_end_of_storage) {
      operator_delete(local_78.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                      _M_impl.super__Vector_impl_data._M_start,
                      (long)local_78.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage + 1);
    }
  }
  local_78.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_78.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_78.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  psVar2 = (node->pn).pi_;
  local_38.px = node->px;
  local_38.pn.pi_ = (node->pn).pi_;
  if (psVar2 != (sp_counted_base *)0x0) {
    LOCK();
    piVar1 = &psVar2->use_count_;
    *piVar1 = *piVar1 + 1;
    UNLOCK();
  }
  ComputeValidJointActionExtensions(this,&local_38,&local_78);
  boost::detail::shared_count::~shared_count(&local_38.pn);
  if (3 < this->_m_verbosity) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"BGIP_SolverBranchAndBound found ",0x20);
    poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3," joint action extensions",0x18);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
    std::ostream::put((char)poVar3);
    std::ostream::flush();
  }
  psVar2 = (node->pn).pi_;
  local_48.px = node->px;
  local_48.pn.pi_ = (node->pn).pi_;
  if (psVar2 != (sp_counted_base *)0x0) {
    LOCK();
    piVar1 = &psVar2->use_count_;
    *piVar1 = *piVar1 + 1;
    UNLOCK();
  }
  Pop(this,&local_48);
  boost::detail::shared_count::~shared_count(&local_48.pn);
  if (local_78.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish !=
      local_78.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start) {
    uVar4 = 0;
    uVar5 = 1;
    do {
      psVar2 = (node->pn).pi_;
      local_58.px = node->px;
      local_58.pn.pi_ = (node->pn).pi_;
      if (psVar2 != (sp_counted_base *)0x0) {
        LOCK();
        piVar1 = &psVar2->use_count_;
        *piVar1 = *piVar1 + 1;
        UNLOCK();
      }
      Expand(this,&local_58,
             local_78.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_start[uVar4]);
      boost::detail::shared_count::~shared_count(&local_58.pn);
      bVar6 = (long)local_78.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                    .super__Vector_impl_data._M_finish -
              (long)local_78.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                    .super__Vector_impl_data._M_start >> 2 != uVar5;
      uVar4 = uVar5;
      uVar5 = (ulong)((int)uVar5 + 1);
    } while (bVar6);
  }
  if (local_78.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_78.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                    .super__Vector_impl_data._M_start,
                    (long)local_78.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_78.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void ExpandAllExtensions(BGIP_BnB_NodePtr node)
    {
        if(_m_verbosity>3)
            std::cout << "BGIP_SolverBranchAndBound Expanding the following node: "
                      << node->SoftPrint(_m_jtIndexMapping) << std::endl;
        // find the valid extensions of this node
        // no by value for std::vectors!
        //std::vector<Index> JAs=
        //ComputeValidJointActionExtensions(node);
        std::vector<Index> JAs;
        ComputeValidJointActionExtensions(node, JAs);
        if(_m_verbosity>3)
            std::cout << "BGIP_SolverBranchAndBound found " << JAs.size()
                      << " joint action extensions" << std::endl;
        
        Pop(node);

        for(Index i=0;i!=JAs.size();++i)
        {
            Expand(node,JAs[i]);
        }

    //    _m_closedQueueIntermediateNodes->push(node);
    }